

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O1

void __thiscall
boost::runtime::parameter<std::__cxx11::string,(boost::runtime::args_amount)0,false>::
parameter<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>
          (parameter<std::__cxx11::string,(boost::runtime::args_amount)0,false> *this,cstring *name,
          named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
          *m)

{
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
  *in_R8;
  cstring local_68 [2];
  undefined8 local_3f;
  undefined4 local_37;
  undefined2 local_33;
  parameter<std::__cxx11::string,(boost::runtime::args_amount)0,false> local_31;
  undefined8 local_1f;
  undefined4 local_17;
  undefined2 local_13;
  parameter<std::__cxx11::string,(boost::runtime::args_amount)0,false> local_11;
  
  local_68[0].m_begin = name->m_begin;
  local_68[0].m_end = name->m_end;
  basic_param::
  basic_param<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>
            ((basic_param *)this,local_68,false,SUB81(m,0),in_R8);
  *(undefined ***)this = &PTR__parameter_001cc200;
  *(parameter<std::__cxx11::string,(boost::runtime::args_amount)0,false> **)(this + 0xf0) =
       this + 0x100;
  this[0x100] = (parameter<std::__cxx11::string,(boost::runtime::args_amount)0,false>)0x0;
  *(undefined8 *)(this + 0x101) = local_1f;
  *(undefined4 *)(this + 0x109) = local_17;
  *(undefined2 *)(this + 0x10d) = local_13;
  this[0x10f] = local_11;
  *(undefined8 *)(this + 0xf8) = 0;
  *(parameter<std::__cxx11::string,(boost::runtime::args_amount)0,false> **)(this + 0x110) =
       this + 0x120;
  this[0x120] = (parameter<std::__cxx11::string,(boost::runtime::args_amount)0,false>)0x0;
  *(undefined8 *)(this + 0x121) = local_3f;
  *(undefined4 *)(this + 0x129) = local_37;
  *(undefined2 *)(this + 0x12d) = local_33;
  this[0x12f] = local_31;
  *(undefined8 *)(this + 0x118) = 0;
  return;
}

Assistant:

parameter( cstring name, Modifiers const& m )
#endif
    : basic_param( name, a != runtime::REQUIRED_PARAM, a == runtime::REPEATABLE_PARAM, m )
    , m_arg_factory( m )
    {
        BOOST_TEST_I_ASSRT( !m.has( default_value ) || a == runtime::OPTIONAL_PARAM,
                            invalid_param_spec() << "Parameter " << name
                                                 << " is not optional and can't have default_value." );

        BOOST_TEST_I_ASSRT( !m.has( optional_value ) || !this->p_repeatable,
                            invalid_param_spec() << "Parameter " << name
                                                 << " is repeatable and can't have optional_value." );
    }